

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

_Bool parse_path_coordinates(char **begin,char *end,float *values,int offset,int count)

{
  _Bool _Var1;
  int local_34;
  int i;
  int count_local;
  int offset_local;
  float *values_local;
  char *end_local;
  char **begin_local;
  
  local_34 = 0;
  while( true ) {
    if (count <= local_34) {
      return true;
    }
    _Var1 = plutovg_parse_number(begin,end,values + (long)offset + (long)local_34);
    if (!_Var1) break;
    plutovg_skip_ws_or_comma(begin,end,(_Bool *)0x0);
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

static inline bool parse_path_coordinates(const char** begin, const char* end, float values[6], int offset, int count)
{
    for(int i = 0; i < count; i++) {
        if(!plutovg_parse_number(begin, end, values + offset + i))
            return false;
        plutovg_skip_ws_or_comma(begin, end, NULL);
    }

    return true;
}